

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v1_decoder.cpp
# Opt level: O0

int __thiscall zmq::v1_decoder_t::one_byte_size_ready(v1_decoder_t *this,uchar *param_2)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int in_ESI;
  EVP_PKEY_CTX *ctx;
  decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator> *in_RDI;
  char *errstr_1;
  char *errstr;
  int rc;
  size_t in_stack_ffffffffffffffb0;
  msg_t *in_stack_ffffffffffffffb8;
  
  if (*(char *)&in_RDI[1].super_i_decoder._vptr_i_decoder == -1) {
    decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>::next_step
              (in_RDI,in_RDI + 1,8,0x24d310);
  }
  else {
    if (*(char *)&in_RDI[1].super_i_decoder._vptr_i_decoder == '\0') {
      piVar2 = __errno_location();
      *piVar2 = 0x47;
      return -1;
    }
    if ((-1 < (long)in_RDI[2]._next) &&
       ((long)in_RDI[2]._next < (long)(int)(*(byte *)&in_RDI[1].super_i_decoder._vptr_i_decoder - 1)
       )) {
      piVar2 = __errno_location();
      *piVar2 = 0x5a;
      return -1;
    }
    msg_t::close((msg_t *)&in_RDI[1]._next,in_ESI);
    ctx = (EVP_PKEY_CTX *)(long)(int)(*(byte *)&in_RDI[1].super_i_decoder._vptr_i_decoder - 1);
    iVar1 = msg_t::init_size(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 0xc) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        ctx = (EVP_PKEY_CTX *)0x258315;
        fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/v1_decoder.cpp"
                ,0x53);
        fflush(_stderr);
        zmq_abort((char *)0x24d13e);
      }
      iVar1 = msg_t::init((msg_t *)&in_RDI[1]._next,ctx);
      if (iVar1 != 0) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/v1_decoder.cpp"
                ,0x55);
        fflush(_stderr);
        zmq_abort((char *)0x24d1b5);
      }
      piVar2 = __errno_location();
      *piVar2 = 0xc;
      return -1;
    }
    decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>::next_step
              (in_RDI,in_RDI + 1,1,0x24d550);
  }
  return 0;
}

Assistant:

int zmq::v1_decoder_t::one_byte_size_ready (unsigned char const *)
{
    //  First byte of size is read. If it is UCHAR_MAX (0xff) read 8-byte size.
    //  Otherwise allocate the buffer for message data and read the
    //  message data into it.
    if (*_tmpbuf == UCHAR_MAX)
        next_step (_tmpbuf, 8, &v1_decoder_t::eight_byte_size_ready);
    else {
        //  There has to be at least one byte (the flags) in the message).
        if (!*_tmpbuf) {
            errno = EPROTO;
            return -1;
        }

        if (_max_msg_size >= 0
            && static_cast<int64_t> (*_tmpbuf - 1) > _max_msg_size) {
            errno = EMSGSIZE;
            return -1;
        }

        int rc = _in_progress.close ();
        assert (rc == 0);
        rc = _in_progress.init_size (*_tmpbuf - 1);
        if (rc != 0) {
            errno_assert (errno == ENOMEM);
            rc = _in_progress.init ();
            errno_assert (rc == 0);
            errno = ENOMEM;
            return -1;
        }

        next_step (_tmpbuf, 1, &v1_decoder_t::flags_ready);
    }
    return 0;
}